

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.hpp
# Opt level: O2

void duckdb::WindowBoundariesState::ClampFrame(idx_t count,idx_t *values,idx_t *begin,idx_t *end)

{
  idx_t i;
  ulong uVar1;
  
  for (i = 0; count != i; i = i + 1) {
    uVar1 = begin[i];
    if (begin[i] < values[i]) {
      uVar1 = values[i];
    }
    if (end[i] <= uVar1) {
      uVar1 = end[i];
    }
    values[i] = uVar1;
  }
  return;
}

Assistant:

static void ClampFrame(const idx_t count, idx_t *values, const idx_t *begin, const idx_t *end) {
		for (idx_t i = 0; i < count; ++i) {
			values[i] = MinValue(MaxValue(values[i], begin[i]), end[i]);
		}
	}